

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase165::run(TestCase165 *this)

{
  PromiseNode *pPVar1;
  __pid_t _Var2;
  TransformPromiseNodeBase *pTVar3;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_a8;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:172:32),_int>
  promise3;
  WaitScope waitScope;
  Promise<int> promise2;
  Promise<int> promise;
  Own<kj::_::PromiseNode> local_58;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  _::yield();
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,&local_a8,
             _::
             TransformPromiseNode<int,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:169:36),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041a520;
  intermediate.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase165::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_58.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase165::run()::$_0,kj::_::PropagateException>>
        ::instance;
  intermediate.ptr = (PromiseNode *)0x0;
  promise.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase165::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_58.ptr = (PromiseNode *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)pTVar3;
  Own<kj::_::PromiseNode>::dispose(&local_58);
  Own<kj::_::PromiseNode>::dispose(&intermediate);
  Own<kj::_::PromiseNode>::dispose(&local_a8);
  _::yield();
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,&local_a8,
             _::
             TransformPromiseNode<int,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:170:37),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041a5a8;
  intermediate.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase165::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_58.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase165::run()::$_1,kj::_::PropagateException>>
        ::instance;
  intermediate.ptr = (PromiseNode *)0x0;
  promise2.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase165::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_58.ptr = (PromiseNode *)0x0;
  promise2.super_PromiseBase.node.ptr = (PromiseNode *)pTVar3;
  Own<kj::_::PromiseNode>::dispose(&local_58);
  Own<kj::_::PromiseNode>::dispose(&intermediate);
  Own<kj::_::PromiseNode>::dispose(&local_a8);
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,(Own<kj::_::PromiseNode> *)&promise,
             _::
             TransformPromiseNode<kj::Promise<int>,_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:172:32),_kj::_::PropagateException>
             ::anon_class_8_1_ac918ff5_for_func::operator());
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041a630;
  pTVar3[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&promise2;
  intermediate.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<int>,int,kj::(anonymous_namespace)::TestCase165::run()::$_2,kj::_::PropagateException>>
        ::instance;
  intermediate.ptr = (PromiseNode *)pTVar3;
  _::maybeChain<int>(&local_a8,(Promise<int> *)&intermediate);
  pPVar1 = local_a8.ptr;
  local_58.disposer = local_a8.disposer;
  local_a8.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_a8);
  promise3.super_PromiseBase.node.disposer = local_a8.disposer;
  promise3.super_PromiseBase.node.ptr = pPVar1;
  local_58.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_58);
  Own<kj::_::PromiseNode>::dispose(&intermediate);
  _Var2 = Promise<int>::wait(&promise3,&waitScope);
  if ((_Var2 != 0x1bc) && (_::Debug::minSeverity < 3)) {
    intermediate.disposer = (Disposer *)CONCAT44(intermediate.disposer._4_4_,0x1bc);
    _Var2 = Promise<int>::wait(&promise3,&waitScope);
    local_58.disposer = (Disposer *)CONCAT44(local_58.disposer._4_4_,_Var2);
    _::Debug::log<char_const(&)[53],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0xb2,ERROR,
               "\"failed: expected \" \"(444) == (promise3.wait(waitScope))\", 444, promise3.wait(waitScope)"
               ,(char (*) [53])"failed: expected (444) == (promise3.wait(waitScope))",
               (int *)&intermediate,(int *)&local_58);
  }
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise3);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise2);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, Chain) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater([&]() -> int { return 123; });
  Promise<int> promise2 = evalLater([&]() -> int { return 321; });

  auto promise3 = promise.then([&](int i) {
    return promise2.then([i](int j) {
      return i + j;
    });
  });

  EXPECT_EQ(444, promise3.wait(waitScope));
}